

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patas_fetch.hpp
# Opt level: O2

void duckdb::PatasFetchRow<float>
               (ColumnSegment *segment,ColumnFetchState *state,row_t row_id,Vector *result,
               idx_t result_idx)

{
  data_ptr_t pdVar1;
  data_ptr_t pdVar2;
  PatasScanState<float> PStack_1c88;
  
  PatasScanState<float>::PatasScanState(&PStack_1c88,segment);
  PatasScanState<float>::Skip(&PStack_1c88,segment,row_id);
  pdVar2 = result->data;
  pdVar1 = pdVar2 + result_idx * 4;
  pdVar1[0] = '\0';
  pdVar1[1] = '\0';
  pdVar1[2] = '\0';
  pdVar1[3] = '\0';
  if (((PStack_1c88.total_value_count & 0x3ff) == 0) &&
     (PStack_1c88.total_value_count < PStack_1c88.count)) {
    PatasScanState<float>::LoadGroup<false>(&PStack_1c88,PStack_1c88.group_state.values);
  }
  *(uint *)(pdVar2 + result_idx * 4) = PStack_1c88.group_state.values[PStack_1c88.group_state.index]
  ;
  PStack_1c88.total_value_count = PStack_1c88.total_value_count + 1;
  PStack_1c88.group_state.index = PStack_1c88.group_state.index + 1;
  PatasScanState<float>::~PatasScanState(&PStack_1c88);
  return;
}

Assistant:

void PatasFetchRow(ColumnSegment &segment, ColumnFetchState &state, row_t row_id, Vector &result, idx_t result_idx) {
	using EXACT_TYPE = typename FloatingToExact<T>::TYPE;

	PatasScanState<T> scan_state(segment);
	scan_state.Skip(segment, UnsafeNumericCast<idx_t>(row_id));
	auto result_data = FlatVector::GetData<EXACT_TYPE>(result);
	result_data[result_idx] = (EXACT_TYPE)0;

	if (scan_state.GroupFinished() && scan_state.total_value_count < scan_state.count) {
		scan_state.LoadGroup(scan_state.group_state.values);
	}
	scan_state.group_state.Scan((uint8_t *)(result_data + result_idx), 1);
	scan_state.total_value_count++;
}